

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionAccept.cpp
# Opt level: O0

void __thiscall ki::protocol::control::SessionAccept::write_to(SessionAccept *this,ostream *ostream)

{
  Field<int> *this_00;
  Field<unsigned_int> *this_01;
  Field<unsigned_short> *this_02;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  ostream *ostream_local;
  SessionAccept *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ostream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"unknown",&local_89);
  ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_88,true);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"unknown2",&local_c1);
  ki::dml::Record::add_field<unsigned_int>((Record *)local_68,(string *)local_c0,true);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"m_timestamp",&local_e9);
  this_00 = ki::dml::Record::add_field<int>((Record *)local_68,(string *)local_e8,true);
  ki::dml::Field<int>::set_value(this_00,this->m_timestamp);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"m_milliseconds",&local_111);
  this_01 = ki::dml::Record::add_field<unsigned_int>((Record *)local_68,(string *)local_110,true);
  ki::dml::Field<unsigned_int>::set_value(this_01,this->m_milliseconds);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"m_session_id",&local_139);
  this_02 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_138,true);
  ki::dml::Field<unsigned_short>::set_value(this_02,this->m_session_id);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  ki::dml::Record::write_to
            ((Record *)local_68,
             (ostream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void SessionAccept::write_to(std::ostream& ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("unknown");
		record.add_field<dml::UINT>("unknown2");
		record.add_field<dml::INT>("m_timestamp")->set_value(m_timestamp);
		record.add_field<dml::UINT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.write_to(ostream);
	}